

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QPersistentModelIndex>>
          (QtPrivate *this,QDebug debug,char *which,QList<QPersistentModelIndex> *c)

{
  quintptr *pqVar1;
  QPersistentModelIndex *pQVar2;
  long lVar3;
  long lVar4;
  _func_int **pp_Var5;
  QDebug *pQVar6;
  QPersistentModelIndex *idx;
  QDebug dbg;
  QPersistentModelIndex *pQVar7;
  long in_FS_OFFSET;
  QPersistentModelIndex local_60;
  undefined1 local_58 [8];
  QPersistentModelIndex local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar6 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar6,'(');
  pQVar7 = (c->d).ptr;
  lVar4 = (c->d).size;
  pQVar2 = pQVar7 + lVar4;
  if (lVar4 == 0) goto LAB_003f74d5;
  local_50.d = (QPersistentModelIndexData *)((debug.stream)->ts)._vptr_QTextStream;
  idx = &local_50;
  pqVar1 = &local_50.d[1].index.i;
  *(int *)pqVar1 = (int)*pqVar1 + 1;
  dbg.stream = (Stream *)local_48;
  ::operator<<(dbg,idx);
  while( true ) {
    QDebug::~QDebug((QDebug *)dbg.stream);
    QDebug::~QDebug((QDebug *)idx);
    pQVar7 = pQVar7 + 1;
LAB_003f74d5:
    if (pQVar7 == pQVar2) break;
    pQVar6 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60.d = (QPersistentModelIndexData *)pQVar6->stream;
    idx = &local_60;
    ((Stream *)local_60.d)->ref = ((Stream *)local_60.d)->ref + 1;
    dbg.stream = (Stream *)local_58;
    ::operator<<(dbg,idx);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var5 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var5;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}